

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

void __thiscall crnlib::mipmapped_texture::clear(mipmapped_texture *this)

{
  free_all_mips(this);
  dynamic_string::clear(&this->m_name);
  this->m_width = 0;
  this->m_height = 0;
  this->m_comp_flags = cDefaultCompFlags;
  this->m_format = PIXEL_FMT_INVALID;
  this->m_source_file_type = cFormatInvalid;
  dynamic_string::clear(&this->m_last_error);
  return;
}

Assistant:

void mipmapped_texture::clear() {
  free_all_mips();

  m_name.clear();
  m_width = 0;
  m_height = 0;
  m_comp_flags = pixel_format_helpers::cDefaultCompFlags;
  m_format = PIXEL_FMT_INVALID;
  m_source_file_type = texture_file_types::cFormatInvalid;
  m_last_error.clear();
}